

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

void __thiscall soul::Value::Value(Value *this,complex<double> v)

{
  undefined8 extraout_RDX;
  complex<double> newValue;
  PackedData local_60;
  Type local_38;
  Value *local_20;
  Value *this_local;
  complex<double> v_local;
  
  local_20 = this;
  Type::Type(&local_38,complex64);
  Value(this,&local_38);
  Type::~Type(&local_38);
  getData(&local_60,this);
  newValue._M_value._8_8_ = extraout_RDX;
  newValue._M_value._0_8_ = this;
  PackedData::setAs<std::complex<double>>(&local_60,newValue);
  return;
}

Assistant:

Value::Value (std::complex<double> v) : Value (Type (PrimitiveType::complex64))   { getData().setAs (v); }